

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O3

int VP8LBitWriterClone(VP8LBitWriter *src,VP8LBitWriter *dst)

{
  int iVar1;
  size_t extra_size;
  
  extra_size = (long)src->cur - (long)src->buf;
  iVar1 = VP8LBitWriterResize(dst,extra_size);
  if (iVar1 != 0) {
    memcpy(dst->buf,src->buf,extra_size);
    dst->bits = src->bits;
    dst->used = src->used;
    dst->error = src->error;
    dst->cur = dst->buf + extra_size;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int VP8LBitWriterClone(const VP8LBitWriter* const src,
                       VP8LBitWriter* const dst) {
  const size_t current_size = src->cur - src->buf;
  assert(src->cur >= src->buf && src->cur <= src->end);
  if (!VP8LBitWriterResize(dst, current_size)) return 0;
  memcpy(dst->buf, src->buf, current_size);
  dst->bits = src->bits;
  dst->used = src->used;
  dst->error = src->error;
  dst->cur = dst->buf + current_size;
  return 1;
}